

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

void __thiscall
vkt::ssbo::ShaderInterface::getNamedStructs
          (ShaderInterface *this,
          vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *structs)

{
  const_iterator this_00;
  bool bVar1;
  reference ppSVar2;
  char *pcVar3;
  __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  local_28;
  __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
  local_20;
  const_iterator i;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *structs_local;
  ShaderInterface *this_local;
  
  i._M_current = (StructType **)structs;
  local_20._M_current =
       (StructType **)
       std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::begin(&this->m_structs);
  while( true ) {
    local_28._M_current =
         (StructType **)
         std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::end(&this->m_structs);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
              ::operator*(&local_20);
    pcVar3 = glu::StructType::getTypeName(*ppSVar2);
    this_00 = i;
    if (pcVar3 != (char *)0x0) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
                ::operator*(&local_20);
      std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::push_back
                ((vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *)
                 this_00._M_current,ppSVar2);
    }
    __gnu_cxx::
    __normal_iterator<glu::StructType_*const_*,_std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>_>
    ::operator++(&local_20,0);
  }
  return;
}

Assistant:

void ShaderInterface::getNamedStructs (std::vector<const StructType*>& structs) const
{
	for (std::vector<StructType*>::const_iterator i = m_structs.begin(); i != m_structs.end(); i++)
	{
		if ((*i)->getTypeName() != DE_NULL)
			structs.push_back(*i);
	}
}